

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter_index_tests.cpp
# Opt level: O1

bool __thiscall
blockfilter_index_tests::BuildChainTestingSetup::BuildChain
          (BuildChainTestingSetup *this,CBlockIndex *pindex,CScript *coinbase_script_pub_key,
          size_t length,
          vector<std::shared_ptr<CBlock>,_std::allocator<std::shared_ptr<CBlock>_>_> *chain)

{
  undefined8 uVar1;
  int32_t iVar2;
  uint32_t uVar3;
  pointer psVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uchar uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  bool bVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *puVar11;
  long lVar12;
  CBlock *pCVar13;
  element_type *peVar14;
  pointer psVar15;
  long in_FS_OFFSET;
  bool bVar16;
  byte bVar17;
  span<const_CBlockHeader,_18446744073709551615UL> headers;
  vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> no_txns;
  BlockValidationState state;
  vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> local_158;
  CBlockIndex *local_138;
  ValidationState<BlockValidationResult> local_130;
  uchar local_e8 [8];
  uchar auStack_e0 [8];
  uchar local_d8 [8];
  uchar auStack_d0 [8];
  uchar local_c8 [8];
  uchar auStack_c0 [8];
  uchar local_b8 [8];
  uchar auStack_b0 [8];
  CBlock local_a8;
  long local_38;
  
  bVar17 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_158.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_158.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158.super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138 = pindex;
  std::vector<std::shared_ptr<CBlock>,_std::allocator<std::shared_ptr<CBlock>_>_>::resize
            (chain,length);
  psVar15 = (chain->
            super__Vector_base<std::shared_ptr<CBlock>,_std::allocator<std::shared_ptr<CBlock>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  psVar4 = (chain->
           super__Vector_base<std::shared_ptr<CBlock>,_std::allocator<std::shared_ptr<CBlock>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  bVar16 = psVar15 == psVar4;
  if (!bVar16) {
    do {
      CreateBlock(&local_a8,this,local_138,&local_158,coinbase_script_pub_key);
      p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x80);
      p_Var10->_M_use_count = 1;
      p_Var10->_M_weak_count = 1;
      p_Var10->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_013d4a10;
      pCVar13 = &local_a8;
      peVar14 = (element_type *)(p_Var10 + 1);
      for (lVar12 = 10; lVar12 != 0; lVar12 = lVar12 + -1) {
        uVar5 = (pCVar13->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0]
        ;
        uVar6 = (pCVar13->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1]
        ;
        uVar7 = (pCVar13->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2]
        ;
        uVar8 = (pCVar13->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3]
        ;
        (peVar14->super_CBlockHeader).nVersion = (pCVar13->super_CBlockHeader).nVersion;
        (peVar14->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = uVar5
        ;
        (peVar14->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = uVar6
        ;
        (peVar14->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = uVar7
        ;
        (peVar14->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = uVar8
        ;
        pCVar13 = (CBlock *)((long)pCVar13 + (ulong)bVar17 * -0x10 + 8);
        peVar14 = (element_type *)((long)peVar14 + (ulong)bVar17 * -0x10 + 8);
      }
      p_Var10[6]._vptr__Sp_counted_base =
           (_func_int **)
           local_a8.vtx.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      *(pointer *)&p_Var10[6]._M_use_count =
           local_a8.vtx.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      p_Var10[7]._vptr__Sp_counted_base =
           (_func_int **)
           local_a8.vtx.
           super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_a8.vtx.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.vtx.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.vtx.
      super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      *(bool *)((long)&p_Var10[7]._M_use_count + 2) = local_a8.m_checked_merkle_root;
      *(undefined2 *)&p_Var10[7]._M_use_count = local_a8._104_2_;
      (psVar15->super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
           (element_type *)(p_Var10 + 1);
      this_00 = (psVar15->super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
      (psVar15->super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var10;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
      std::
      vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
      ::~vector(&local_a8.vtx);
      peVar14 = (psVar15->super___shared_ptr<CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      iVar2 = (peVar14->super_CBlockHeader).nVersion;
      local_b8 = *(uchar (*) [8])
                  ((long)(peVar14->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data.
                         _M_elems + 0x10);
      auStack_b0 = *(uchar (*) [8])
                    ((long)(peVar14->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data.
                           _M_elems + 0x18);
      local_c8 = *(uchar (*) [8])
                  (peVar14->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data._M_elems;
      auStack_c0 = *(uchar (*) [8])
                    ((long)(peVar14->super_CBlockHeader).hashPrevBlock.super_base_blob<256U>.m_data.
                           _M_elems + 8);
      local_e8 = *(uchar (*) [8])
                  (peVar14->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data._M_elems
      ;
      auStack_e0 = *(uchar (*) [8])
                    ((long)(peVar14->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data
                           ._M_elems + 8);
      local_d8 = *(uchar (*) [8])
                  ((long)(peVar14->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data.
                         _M_elems + 0x10);
      auStack_d0 = *(uchar (*) [8])
                    ((long)(peVar14->super_CBlockHeader).hashMerkleRoot.super_base_blob<256U>.m_data
                           ._M_elems + 0x18);
      uVar1._0_4_ = (peVar14->super_CBlockHeader).nTime;
      uVar1._4_4_ = (peVar14->super_CBlockHeader).nBits;
      uVar3 = (peVar14->super_CBlockHeader).nNonce;
      local_130.m_mode = M_VALID;
      local_130.m_result = BLOCK_RESULT_UNSET;
      local_130.m_reject_reason._M_dataplus._M_p = (pointer)&local_130.m_reject_reason.field_2;
      local_130.m_reject_reason._M_string_length = 0;
      local_130.m_reject_reason.field_2._M_local_buf[0] = '\0';
      local_130.m_debug_message._M_dataplus._M_p = (pointer)&local_130.m_debug_message.field_2;
      local_130.m_debug_message._M_string_length = 0;
      local_130.m_debug_message.field_2._M_local_buf[0] = '\0';
      puVar11 = inline_assertion_check<true,std::unique_ptr<ChainstateManager,std::default_delete<ChainstateManager>>&>
                          (&(this->super_TestChain100Setup).super_TestingSetup.
                            super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman,
                           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockfilter_index_tests.cpp"
                           ,0x6a,"BuildChain","m_node.chainman");
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] =
           local_b8[0];
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] =
           local_b8[1];
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] =
           local_b8[2];
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] =
           local_b8[3];
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] =
           local_b8[4];
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] =
           local_b8[5];
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] =
           local_b8[6];
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] =
           local_b8[7];
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] =
           auStack_b0[0];
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] =
           auStack_b0[1];
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] =
           auStack_b0[2];
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] =
           auStack_b0[3];
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] =
           auStack_b0[4];
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] =
           auStack_b0[5];
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] =
           auStack_b0[6];
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] =
           auStack_b0[7];
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] =
           local_c8[0];
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] =
           local_c8[1];
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] =
           local_c8[2];
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] =
           local_c8[3];
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] =
           local_c8[4];
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] =
           local_c8[5];
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] =
           local_c8[6];
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] =
           local_c8[7];
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] =
           auStack_c0[0];
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] =
           auStack_c0[1];
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] =
           auStack_c0[2];
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] =
           auStack_c0[3];
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] =
           auStack_c0[4];
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] =
           auStack_c0[5];
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] =
           auStack_c0[6];
      local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] =
           auStack_c0[7];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] =
           local_d8[0];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] =
           local_d8[1];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] =
           local_d8[2];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] =
           local_d8[3];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] =
           local_d8[4];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] =
           local_d8[5];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] =
           local_d8[6];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] =
           local_d8[7];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] =
           auStack_d0[0];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] =
           auStack_d0[1];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] =
           auStack_d0[2];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] =
           auStack_d0[3];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] =
           auStack_d0[4];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] =
           auStack_d0[5];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] =
           auStack_d0[6];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] =
           auStack_d0[7];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] =
           local_e8[0];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] =
           local_e8[1];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] =
           local_e8[2];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] =
           local_e8[3];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] =
           local_e8[4];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] =
           local_e8[5];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] =
           local_e8[6];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] =
           local_e8[7];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] =
           auStack_e0[0];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] =
           auStack_e0[1];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] =
           auStack_e0[2];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] =
           auStack_e0[3];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] =
           auStack_e0[4];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] =
           auStack_e0[5];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] =
           auStack_e0[6];
      local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] =
           auStack_e0[7];
      headers._M_extent._M_extent_value = 1;
      headers._M_ptr = &local_a8.super_CBlockHeader;
      local_a8.super_CBlockHeader.nVersion = iVar2;
      local_a8.super_CBlockHeader._68_8_ = uVar1;
      local_a8.super_CBlockHeader.nNonce = uVar3;
      bVar9 = ChainstateManager::ProcessNewBlockHeaders
                        ((puVar11->_M_t).
                         super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                         .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,headers,
                         true,(BlockValidationState *)&local_130,&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130.m_debug_message._M_dataplus._M_p != &local_130.m_debug_message.field_2) {
        operator_delete(local_130.m_debug_message._M_dataplus._M_p,
                        CONCAT71(local_130.m_debug_message.field_2._M_allocated_capacity._1_7_,
                                 local_130.m_debug_message.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130.m_reject_reason._M_dataplus._M_p != &local_130.m_reject_reason.field_2) {
        operator_delete(local_130.m_reject_reason._M_dataplus._M_p,
                        CONCAT71(local_130.m_reject_reason.field_2._M_allocated_capacity._1_7_,
                                 local_130.m_reject_reason.field_2._M_local_buf[0]) + 1);
      }
      if (!bVar9) break;
      psVar15 = psVar15 + 1;
      bVar16 = psVar15 == psVar4;
    } while (!bVar16);
  }
  std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector(&local_158);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar16;
  }
  __stack_chk_fail();
}

Assistant:

bool BuildChainTestingSetup::BuildChain(const CBlockIndex* pindex,
    const CScript& coinbase_script_pub_key,
    size_t length,
    std::vector<std::shared_ptr<CBlock>>& chain)
{
    std::vector<CMutableTransaction> no_txns;

    chain.resize(length);
    for (auto& block : chain) {
        block = std::make_shared<CBlock>(CreateBlock(pindex, no_txns, coinbase_script_pub_key));
        CBlockHeader header = block->GetBlockHeader();

        BlockValidationState state;
        if (!Assert(m_node.chainman)->ProcessNewBlockHeaders({{header}}, true, state, &pindex)) {
            return false;
        }
    }

    return true;
}